

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Postprocess_AddMetadata
          (AMFImporter *this,
          list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
          *metadataList,aiNode *sceneNode)

{
  aiNode *this_00;
  bool bVar1;
  DeadlyImportError *this_01;
  size_type sVar2;
  aiMetadata *paVar3;
  reference ppCVar4;
  aiString local_514;
  CAMFImporter_NodeElement_Metadata local_110;
  CAMFImporter_NodeElement_Metadata *local_80;
  CAMFImporter_NodeElement_Metadata *metadata;
  const_iterator __end2;
  const_iterator __begin2;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  *__range2;
  size_t meta_idx;
  allocator local_41;
  string local_40;
  aiNode *local_20;
  aiNode *sceneNode_local;
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  *metadataList_local;
  AMFImporter *this_local;
  
  local_20 = sceneNode;
  sceneNode_local = (aiNode *)metadataList;
  metadataList_local =
       (list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
        *)this;
  bVar1 = std::__cxx11::
          list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
          ::empty(metadataList);
  if (!bVar1) {
    if (local_20->mMetaData != (aiMetadata *)0x0) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_40,
                 "Postprocess. MetaData member in node are not nullptr. Something went wrong.",
                 &local_41);
      DeadlyImportError::DeadlyImportError(this_01,&local_40);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar2 = std::__cxx11::
            list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
            ::size((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                    *)sceneNode_local);
    paVar3 = aiMetadata::Alloc((uint)sVar2);
    this_00 = sceneNode_local;
    local_20->mMetaData = paVar3;
    __range2 = (list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                *)0x0;
    __end2 = std::__cxx11::
             list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
             ::begin((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                      *)sceneNode_local);
    metadata = (CAMFImporter_NodeElement_Metadata *)
               std::__cxx11::
               list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
               ::end((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                      *)this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&metadata), bVar1) {
      ppCVar4 = std::_List_const_iterator<CAMFImporter_NodeElement_Metadata_*>::operator*(&__end2);
      CAMFImporter_NodeElement_Metadata::CAMFImporter_NodeElement_Metadata
                (&local_110,&(*ppCVar4)->super_CAMFImporter_NodeElement);
      paVar3 = local_20->mMetaData;
      local_80 = &local_110;
      aiString::aiString(&local_514,&local_110.Value);
      aiMetadata::Set<aiString>(paVar3,(uint)__range2,&local_110.Type,&local_514);
      CAMFImporter_NodeElement_Metadata::~CAMFImporter_NodeElement_Metadata(&local_110);
      std::_List_const_iterator<CAMFImporter_NodeElement_Metadata_*>::operator++(&__end2);
      __range2 = (list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                  *)((long)&(__range2->
                            super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                            )._M_impl._M_node.super__List_node_base._M_next + 1);
    }
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_AddMetadata(const std::list<CAMFImporter_NodeElement_Metadata*>& metadataList, aiNode& sceneNode) const
{
	if ( !metadataList.empty() )
	{
		if(sceneNode.mMetaData != nullptr) throw DeadlyImportError("Postprocess. MetaData member in node are not nullptr. Something went wrong.");

		// copy collected metadata to output node.
        sceneNode.mMetaData = aiMetadata::Alloc( static_cast<unsigned int>(metadataList.size()) );
		size_t meta_idx( 0 );

		for(const CAMFImporter_NodeElement_Metadata& metadata: metadataList)
		{
			sceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx++), metadata.Type, aiString(metadata.Value));
		}
	}// if(!metadataList.empty())
}